

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::printAttributeValue<int>(Engine *fp,IO *io,Attribute<int> *attribute)

{
  DataType adiosvartype;
  size_t j;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  adiosvartype = *(DataType *)(attribute + 0x28);
  if (attribute[0x38] == (Attribute<int>)0x1) {
    print_data(attribute + 0x58,0,adiosvartype,true,false);
  }
  else {
    fputc(0x7b,outf);
    uVar3 = *(long *)(attribute + 0x48) - *(long *)(attribute + 0x40) >> 2;
    lVar2 = 0;
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      print_data((void *)(*(long *)(attribute + 0x40) + lVar2),0,adiosvartype,true,false);
      if (uVar1 < uVar3 - 1) {
        fwrite(", ",2,1,outf);
      }
      lVar2 = lVar2 + 4;
    }
    fputc(0x7d,outf);
  }
  return 0;
}

Assistant:

int printAttributeValue(core::Engine *fp, core::IO *io, core::Attribute<T> *attribute)
{
    DataType adiosvartype = attribute->m_Type;
    if (attribute->m_IsSingleValue)
    {
        print_data((void *)&attribute->m_DataSingleValue, 0, adiosvartype, true);
    }
    else
    {
        fprintf(outf, "{");
        size_t nelems = attribute->m_DataArray.size();
        for (size_t j = 0; j < nelems; j++)
        {
            print_data((void *)&attribute->m_DataArray[j], 0, adiosvartype, true);
            if (j < nelems - 1)
            {
                fprintf(outf, ", ");
            }
        }
        fprintf(outf, "}");
    }
    return 0;
}